

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

int ON_SubDComponentAndPoint::CompareComponent
              (ON_SubDComponentAndPoint *lhs,ON_SubDComponentAndPoint *rhs)

{
  ON_SubDComponentAndPoint *rhs_local;
  ON_SubDComponentAndPoint *lhs_local;
  
  if (lhs == rhs) {
    lhs_local._4_4_ = 0;
  }
  else if (lhs == (ON_SubDComponentAndPoint *)0x0) {
    lhs_local._4_4_ = -1;
  }
  else if (rhs == (ON_SubDComponentAndPoint *)0x0) {
    lhs_local._4_4_ = 1;
  }
  else {
    lhs_local._4_4_ = ON_SubDComponentPtr::CompareComponent(&lhs->m_cptr,&rhs->m_cptr);
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_SubDComponentAndPoint::CompareComponent(
  const ON_SubDComponentAndPoint* lhs,
  const ON_SubDComponentAndPoint* rhs
)
{
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return -1;
  if (nullptr == rhs)
    return 1;
  return ON_SubDComponentPtr::CompareComponent(&lhs->m_cptr, &rhs->m_cptr);
}